

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_randomize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  size_t sVar1;
  int iVar2;
  mbedtls_mpi ll;
  mbedtls_mpi l;
  int local_74;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  sVar1 = grp->pbits;
  mbedtls_mpi_init(&local_48);
  mbedtls_mpi_init(&local_60);
  local_74 = 0;
  do {
    iVar2 = mbedtls_mpi_fill_random(&local_48,sVar1 + 7 >> 3,f_rng,p_rng);
    while( true ) {
      if (iVar2 != 0) goto LAB_00121f1f;
      iVar2 = mbedtls_mpi_cmp_mpi(&local_48,&grp->P);
      if (iVar2 < 0) break;
      iVar2 = mbedtls_mpi_shift_r(&local_48,1);
    }
    if (local_74 == 0xb) {
      return -0x4d00;
    }
    local_74 = local_74 + 1;
    iVar2 = mbedtls_mpi_cmp_int(&local_48,1);
  } while (iVar2 < 1);
  X = &pt->Z;
  iVar2 = mbedtls_mpi_mul_mpi(X,X,&local_48);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(X,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    iVar2 = 0;
  }
  if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_mul_mod(grp,&local_60,&local_48,&local_48), iVar2 == 0)
       ) && (iVar2 = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,&local_60), iVar2 == 0)) &&
     (iVar2 = mbedtls_mpi_mul_mod(grp,&local_60,&local_60,&local_48), iVar2 == 0)) {
    iVar2 = mbedtls_mpi_mul_mod(grp,&pt->Y,&pt->Y,&local_60);
  }
LAB_00121f1f:
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_60);
  return iVar2;
}

Assistant:

static int ecp_randomize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi l, ll;
    size_t p_size;
    int count = 0;

#if defined(MBEDTLS_ECP_RANDOMIZE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_randomize_jac( grp, pt, f_rng, p_rng ) );
#endif /* MBEDTLS_ECP_RANDOMIZE_JAC_ALT */

    p_size = ( grp->pbits + 7 ) / 8;
    mbedtls_mpi_init( &l ); mbedtls_mpi_init( &ll );

    /* Generate l such that 1 < l < p */
    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng ) );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    /* Z = l * Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Z,   &pt->Z,     &l  ) );

    /* X = l^2 * X */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ll,      &l,         &l  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->X,   &pt->X,     &ll ) );

    /* Y = l^3 * Y */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ll,      &ll,        &l  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Y,   &pt->Y,     &ll ) );

cleanup:
    mbedtls_mpi_free( &l ); mbedtls_mpi_free( &ll );

    return( ret );
}